

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
          (TabulationRecord *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  long lVar2;
  pointer args;
  long lVar3;
  long lVar4;
  pointer source;
  bool bVar5;
  int MT_local;
  int MF_local;
  int MAT_local;
  long local_38;
  
  MT_local = MT;
  MF_local = MF;
  MAT_local = MAT;
  record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
            (&this->super_InterpolationBase,it,MAT,MF,MT);
  source = (this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)source;
  lVar4 = lVar3 >> 3;
  auVar1._8_8_ = lVar3 >> 0x3f;
  auVar1._0_8_ = lVar4;
  lVar3 = SUB168(auVar1 / SEXT816(3),0);
  lVar2 = lVar3 * -3;
  args = (this->yValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_38 = lVar3;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    tools::disco::
    Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::
    write<std::back_insert_iterator<std::__cxx11::string>,double,double,double,double,double,double,int,int,int>
              (it,source,args,source + 1,args + 1,source + 2,args + 2,&MAT_local,&MF_local,&MT_local
              );
    source = source + 3;
    args = args + 3;
  }
  lVar2 = lVar2 + lVar4;
  if (lVar2 != 0) {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
                (source[lVar3],it);
      tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
                (args[lVar3],it);
    }
    for (lVar3 = lVar4 * 2 + local_38 * -6 + -6; lVar3 != 0; lVar3 = lVar3 + 1) {
      tools::disco::Column<11u>::write<std::back_insert_iterator<std::__cxx11::string>>(it);
    }
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,&MAT_local,&MF_local,&MT_local);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {
  record::InterpolationBase::print( it, MAT, MF, MT );

  using namespace njoy::tools;

  using Format = disco::Record< disco::ENDF, disco::ENDF,
                                disco::ENDF, disco::ENDF,
                                disco::ENDF, disco::ENDF,
                                disco::Integer< 4 >, disco::Integer< 2 >,
                                disco::Integer< 3 >, disco::Column< 5 > >;

  auto nFullLines = this->NP() / 3;
  auto partialLineEntries = this->NP() - nFullLines * 3;

  auto x = this->x().begin();
  auto y = this->y().begin();

  while ( nFullLines-- ){
    Format::write( it, x[0], y[0], x[1], y[1], x[2], y[2], MAT, MF, MT );
    x += 3; y += 3;
  }

  if ( partialLineEntries ){
    auto blankEntries = 2 * ( 3 - partialLineEntries );
    while ( partialLineEntries-- ){
      disco::ENDF::write( *x, it );
      disco::ENDF::write( *y, it );
      ++x; ++y;
    }

    while ( blankEntries-- ){ disco::Column< 11 >::write( it ); }

    using Format =
      disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                     disco::Integer< 3 >, disco::Column< 5 > >;

    Format::write( it, MAT, MF, MT );
  }
}